

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldRejectRequestWithWrongPassword_Test::
BasicAuthIntegrationTest_shouldRejectRequestWithWrongPassword_Test
          (BasicAuthIntegrationTest_shouldRejectRequestWithWrongPassword_Test *this)

{
  BasicAuthIntegrationTest_shouldRejectRequestWithWrongPassword_Test *this_local;
  
  BasicAuthIntegrationTest::BasicAuthIntegrationTest(&this->super_BasicAuthIntegrationTest);
  (this->super_BasicAuthIntegrationTest).super_IntegrationTest.super_Test._vptr_Test =
       (_func_int **)
       &PTR__BasicAuthIntegrationTest_shouldRejectRequestWithWrongPassword_Test_00241fe0;
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldRejectRequestWithWrongPassword) {
  fetchPrePerform_ = [&](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
    curl_easy_setopt(curl, CURLOPT_USERNAME, username_.c_str());
    curl_easy_setopt(curl, CURLOPT_PASSWORD, "dummy");
  };

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 401);
}